

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O3

void raviV_close(lua_State *L)

{
  global_State *pgVar1;
  ravi_State *__ptr;
  
  pgVar1 = L->l_G;
  __ptr = pgVar1->ravi_state;
  if (__ptr != (ravi_State *)0x0) {
    if (__ptr->jit != (MIR_context_t)0x0) {
      MIR_finish(__ptr->jit);
      __ptr = pgVar1->ravi_state;
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void raviV_close(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state == NULL)
    return;
  // All compiled functions will be deleted at this stage
  if (G->ravi_state->jit) {
    MIR_finish(G->ravi_state->jit);
  }
  free(G->ravi_state);
}